

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-overlay-page.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  reference pvVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  ostream *poVar5;
  char *pcVar6;
  int extraout_EDX;
  element_type *peVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDF inpdf;
  allocator<char> local_221;
  QPDF stamppdf;
  int min_suffix;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  QPDFMatrix m;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0 [5];
  QPDFObjectHandle stamp_fo;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_198;
  QPDFObjectHandle foreign_fo;
  element_type *local_178;
  element_type *local_170;
  undefined1 local_160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_150 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  string local_140 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  undefined1 local_130 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  string content;
  QPDFObjectHandle resources;
  QPDFPageObjectHelper local_f0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined4 local_a8;
  undefined4 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_90;
  string name;
  QPDFPageObjectHelper stamp_page_1;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 4) {
    pcVar6 = argv[1];
    pcVar1 = argv[2];
    pcVar2 = argv[3];
    QPDF::QPDF(&inpdf);
    QPDF::processFile((char *)&inpdf,pcVar6);
    QPDF::QPDF(&stamppdf);
    QPDF::processFile((char *)&stamppdf,pcVar1);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_f0,&stamppdf);
    QPDFPageDocumentHelper::getAllPages();
    pvVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                       ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&m,0)
    ;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&stamp_page_1,pvVar3);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&m);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_f0);
    QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&foreign_fo,0));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&foreign_fo);
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&inpdf;
    QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stamp_fo;
    QPDF::copyForeignObject(QVar8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_f0,&inpdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_f0);
    for (peVar7 = local_178; peVar7 != local_170; peVar7 = peVar7 + 0x38) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m,"/Resources",(allocator<char> *)&name);
      QPDFPageObjectHelper::getAttribute((string *)&resources,SUB81(peVar7,0));
      std::__cxx11::string::~string((string *)&m);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m,"/Fx",(allocator<char> *)&content);
      QPDFObjectHandle::getUniqueResourceName((string *)&name,(int *)&resources,(set *)&m);
      std::__cxx11::string::~string((string *)&m);
      QPDFMatrix::QPDFMatrix(&m);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_198,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&stamp_fo);
      QPDFPageObjectHelper::getTrimBox(SUB81(&local_208,0),SUB81(peVar7,0));
      QPDFObjectHandle::getArrayAsRectangle();
      QPDFPageObjectHelper::placeFormXObject
                (&content,peVar7,&local_198,&name,&m,1,local_a8,uStack_a0,local_98,uStack_90,1,0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_208._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198._M_refcount);
      if (content._M_string_length != 0) {
        operator____qpdf((char *)local_130,0x103079);
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130;
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)&resources;
        QPDFObjectHandle::mergeResources(QVar9,(map *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"/XObject",&local_221);
        QPDFObjectHandle::getKey(local_140);
        QPDFObjectHandle::replaceKey(local_140,(QPDFObjectHandle *)&name);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"q\n",(allocator<char> *)local_140);
        QPDF::newStream((string *)local_150);
        QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150;
        QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar7;
        QPDFPageObjectHelper::addPageContents(QVar10,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
        std::__cxx11::string::~string((string *)&local_208);
        std::operator+(&local_208,"\nQ\n",&content);
        QPDF::newStream((string *)local_160);
        QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160;
        QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar7;
        QPDFPageObjectHelper::addPageContents(QVar11,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
        std::__cxx11::string::~string((string *)&local_208);
      }
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_f0,&stamp_page_1);
      QPDFPageObjectHelper::copyAnnotations
                ((QPDFPageObjectHelper *)peVar7,(QPDFMatrix *)&local_f0,
                 (QPDFAcroFormDocumentHelper *)&m,(QPDFAcroFormDocumentHelper *)0x0);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_f0);
      std::__cxx11::string::~string((string *)&content);
      std::__cxx11::string::~string((string *)&name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_178);
    QPDFWriter::QPDFWriter((QPDFWriter *)&m,&inpdf,pcVar2);
    QPDFWriter::setStaticID(SUB81(&m,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&stamp_fo.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&foreign_fo.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&stamp_page_1);
    QPDF::~QPDF(&stamppdf);
    QPDF::~QPDF(&inpdf);
    return 0;
  }
  usage();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&foreign_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::~QPDFPageObjectHelper(&stamp_page_1);
  QPDF::~QPDF(&stamppdf);
  QPDF::~QPDF(&inpdf);
  if (extraout_EDX == 1) {
    plVar4 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar5 = std::operator<<((ostream *)&std::cerr,whoami);
    poVar5 = std::operator<<(poVar5,": ");
    pcVar6 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 4) {
        usage();
    }
    char const* infile = argv[1];
    char const* stampfile = argv[2];
    char const* outfile = argv[3];

    try {
        stamp_page(infile, stampfile, outfile);
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }
    return 0;
}